

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

void uncover(DancingNode *targetDancingNode,
            vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
            *Matrix)

{
  s_DancingNode *psVar1;
  reference this;
  reference pvVar2;
  DancingNode *colDancingNode;
  DancingNode *leftDancingNode;
  DancingNode *rowDancingNode;
  vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
  *Matrix_local;
  DancingNode *targetDancingNode_local;
  
  psVar1 = targetDancingNode->column;
  for (leftDancingNode = psVar1->up; leftDancingNode != psVar1;
      leftDancingNode = leftDancingNode->up) {
    for (colDancingNode = leftDancingNode->left; colDancingNode != leftDancingNode;
        colDancingNode = colDancingNode->left) {
      colDancingNode->up->down = colDancingNode;
      colDancingNode->down->up = colDancingNode;
      this = std::
             vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             ::operator[](Matrix,0);
      pvVar2 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                         (this,(long)colDancingNode->col);
      pvVar2->nodeCount = pvVar2->nodeCount + 1;
    }
  }
  psVar1->left->right = psVar1;
  psVar1->right->left = psVar1;
  return;
}

Assistant:

void uncover(DancingNode *targetDancingNode, vector<vector<DancingNode>> &Matrix) 
{ 
    DancingNode *rowDancingNode, *leftDancingNode; 
  
    // get the pointer to the header of column 
    // to which this node belong  
    DancingNode *colDancingNode = targetDancingNode->column; 
  
    // Move down the column and link back 
    // each row by traversing left 
    for(rowDancingNode = colDancingNode->up; rowDancingNode != colDancingNode; rowDancingNode = rowDancingNode->up) 
    { 
        for(leftDancingNode = rowDancingNode->left; leftDancingNode != rowDancingNode; 
            leftDancingNode = leftDancingNode->left) 
        { 
            leftDancingNode->up->down = leftDancingNode; 
            leftDancingNode->down->up = leftDancingNode; 
  
            // after linking row node, increment the 
            // node count in column header 
            Matrix[0][leftDancingNode->col].nodeCount += 1; 
        } 
    } 
  
    // link the column header from it's neighbors 
    colDancingNode->left->right = colDancingNode; 
    colDancingNode->right->left = colDancingNode; 
}